

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::ImageFeatureType::ByteSizeLong(ImageFeatureType *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  
  if (this->width_ == 0) {
    sVar4 = 0;
  }
  else {
    uVar2 = this->width_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar4 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->height_ != 0) {
    uVar2 = this->height_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar4 = sVar4 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->colorspace_ != 0) {
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->colorspace_);
    sVar4 = sVar4 + sVar3 + 1;
  }
  if (this->_oneof_case_[0] == 0x1f) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ImageFeatureType_ImageSizeRange>
                      ((this->SizeFlexibility_).imagesizerange_);
  }
  else {
    if (this->_oneof_case_[0] != 0x15) goto LAB_004d3e32;
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ImageFeatureType_EnumeratedImageSizes>
                      ((this->SizeFlexibility_).enumeratedsizes_);
  }
  sVar4 = sVar4 + sVar3 + 2;
LAB_004d3e32:
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t ImageFeatureType::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ImageFeatureType)
  size_t total_size = 0;

  // int64 width = 1;
  if (this->width() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->width());
  }

  // int64 height = 2;
  if (this->height() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->height());
  }

  // .CoreML.Specification.ImageFeatureType.ColorSpace colorSpace = 3;
  if (this->colorspace() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->colorspace());
  }

  switch (SizeFlexibility_case()) {
    // .CoreML.Specification.ImageFeatureType.EnumeratedImageSizes enumeratedSizes = 21;
    case kEnumeratedSizes: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *SizeFlexibility_.enumeratedsizes_);
      break;
    }
    // .CoreML.Specification.ImageFeatureType.ImageSizeRange imageSizeRange = 31;
    case kImageSizeRange: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *SizeFlexibility_.imagesizerange_);
      break;
    }
    case SIZEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}